

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O3

void __thiscall
tchecker::algorithms::covreach::
algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t>::remove_covered_nodes
          (algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t> *this,
          graph_t *graph,node_sptr_t *node,
          vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>
          *covered_nodes,stats_t *stats)

{
  pointer piVar1;
  unsigned_long *puVar2;
  node_sptr_t *covered_node;
  pointer this_00;
  pointer piVar3;
  back_insert_iterator<std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>_>
  covered_nodes_inserter;
  back_insert_iterator<std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>_>
  local_38;
  
  piVar3 = (covered_nodes->
           super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  piVar1 = (covered_nodes->
           super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this_00 = piVar3;
  local_38.container = covered_nodes;
  if (piVar1 != piVar3) {
    do {
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != piVar1);
    (covered_nodes->
    super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = piVar3;
  }
  tchecker::graph::cover::
  graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t>,unsigned_long,1ul>>,tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>::node_sptr_hash_t,tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>::node_sptr_le_t>
  ::
  covered_nodes<std::back_insert_iterator<std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t>,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t>,unsigned_long,1ul>>>>>>
            ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t>,unsigned_long,1ul>>,tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>::node_sptr_hash_t,tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>::node_sptr_le_t>
              *)&(graph->
                 super_graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
                 )._cover_graph,node,&local_38);
  piVar1 = (covered_nodes->
           super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (piVar3 = (covered_nodes->
                super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    tchecker::graph::subsumption::
    graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
    ::move_incoming_edges
              (&graph->
                super_graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
               ,piVar3,node,EDGE_SUBSUMPTION);
    tchecker::graph::subsumption::
    graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
    ::remove_edges(&graph->
                    super_graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
                   ,piVar3);
    tchecker::graph::subsumption::
    graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
    ::remove_node(&graph->
                   super_graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
                  ,piVar3);
    puVar2 = stats_t::covered_states(stats);
    *puVar2 = *puVar2 + 1;
  }
  return;
}

Assistant:

void remove_covered_nodes(GRAPH & graph, typename GRAPH::node_sptr_t const & node,
                            std::vector<typename GRAPH::node_sptr_t> & covered_nodes,
                            tchecker::algorithms::covreach::stats_t & stats)
  {
    auto covered_nodes_inserter = std::back_inserter(covered_nodes);

    covered_nodes.clear();
    graph.covered_nodes(node, covered_nodes_inserter);
    for (typename GRAPH::node_sptr_t const & covered_node : covered_nodes) {
      graph.move_incoming_edges(covered_node, node, tchecker::graph::subsumption::EDGE_SUBSUMPTION);
      graph.remove_edges(covered_node);
      graph.remove_node(covered_node);
      ++stats.covered_states();
    }
  }